

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsForSamplers
          (GPUShaderFP64Test1 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  char *local_248;
  MessageBuilder local_240;
  int local_c0;
  GLenum error_code;
  _uniform_function local_ac;
  _uniform_function local_a8;
  _uniform_function uniform_function;
  uint n_uniform_function;
  bool result;
  Functions *gl;
  double double_data [16];
  GPUShaderFP64Test1 *this_local;
  
  memcpy(&gl,&DAT_029ee860,0x80);
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _n_uniform_function = CONCAT44(extraout_var,iVar1);
  uniform_function._3_1_ = 1;
  for (local_a8 = UNIFORM_FUNCTION_1D; local_a8 < UNIFORM_FUNCTION_COUNT;
      local_a8 = local_a8 + UNIFORM_FUNCTION_1DV) {
    local_ac = local_a8;
    switch(local_a8) {
    case UNIFORM_FUNCTION_1D:
      (**(code **)(_n_uniform_function + 0x14d0))(0,this->m_po_sampler_uniform_location);
      break;
    case UNIFORM_FUNCTION_1DV:
      (**(code **)(_n_uniform_function + 0x14d8))(this->m_po_sampler_uniform_location,1,&gl);
      break;
    case UNIFORM_FUNCTION_2D:
      (**(code **)(_n_uniform_function + 0x1510))
                (0,0x3ff0000000000000,this->m_po_sampler_uniform_location);
      break;
    case UNIFORM_FUNCTION_2DV:
      (**(code **)(_n_uniform_function + 0x1518))(this->m_po_sampler_uniform_location,1,&gl);
      break;
    case UNIFORM_FUNCTION_3D:
      (**(code **)(_n_uniform_function + 0x1550))
                (0,0x3ff0000000000000,0x4000000000000000,this->m_po_sampler_uniform_location);
      break;
    case UNIFORM_FUNCTION_3DV:
      (**(code **)(_n_uniform_function + 0x1558))(this->m_po_sampler_uniform_location,1,&gl);
      break;
    case UNIFORM_FUNCTION_4D:
      (**(code **)(_n_uniform_function + 0x1590))
                (0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000,
                 this->m_po_sampler_uniform_location);
      break;
    case UNIFORM_FUNCTION_4DV:
      (**(code **)(_n_uniform_function + 0x1598))(this->m_po_sampler_uniform_location,1,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX2DV:
      (**(code **)(_n_uniform_function + 0x15d8))(this->m_po_sampler_uniform_location,1,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX2X3DV:
      (**(code **)(_n_uniform_function + 0x15e8))(this->m_po_sampler_uniform_location,1,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX2X4DV:
      (**(code **)(_n_uniform_function + 0x15f8))(this->m_po_sampler_uniform_location,1,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX3DV:
      (**(code **)(_n_uniform_function + 0x1608))(this->m_po_sampler_uniform_location,1,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX3X2DV:
      (**(code **)(_n_uniform_function + 0x1618))(this->m_po_sampler_uniform_location,1,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX3X4DV:
      (**(code **)(_n_uniform_function + 0x1628))(this->m_po_sampler_uniform_location,1,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX4DV:
      (**(code **)(_n_uniform_function + 0x1638))(this->m_po_sampler_uniform_location,1,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX4X2DV:
      (**(code **)(_n_uniform_function + 0x1648))(this->m_po_sampler_uniform_location,1,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX4X3DV:
      (**(code **)(_n_uniform_function + 0x1658))(this->m_po_sampler_uniform_location,1,0,&gl);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized uniform function",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x978);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_c0 = (**(code **)(_n_uniform_function + 0x800))();
    if (local_c0 != 0x502) {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_240,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_240,(char (*) [10])"Function ");
      local_248 = getUniformFunctionString(this,local_ac);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_248);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (pMVar3,(char (*) [69])
                                 "() did not generate an error when applied against a sampler uniform."
                         );
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_240);
      uniform_function._3_1_ = UNIFORM_FUNCTION_1D >> 0x18;
    }
  }
  return (bool)(uniform_function._3_1_ & 1);
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsForSamplers()
{
	const double double_data[] = {
		1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0, 8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0, 16.0
	};
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	for (unsigned int n_uniform_function = UNIFORM_FUNCTION_FIRST; n_uniform_function < UNIFORM_FUNCTION_COUNT;
		 ++n_uniform_function)
	{
		_uniform_function uniform_function = (_uniform_function)n_uniform_function;

		switch (uniform_function)
		{
		case UNIFORM_FUNCTION_1D:
			gl.uniform1d(m_po_sampler_uniform_location, 0.0);
			break;
		case UNIFORM_FUNCTION_2D:
			gl.uniform2d(m_po_sampler_uniform_location, 0.0, 1.0);
			break;
		case UNIFORM_FUNCTION_3D:
			gl.uniform3d(m_po_sampler_uniform_location, 0.0, 1.0, 2.0);
			break;
		case UNIFORM_FUNCTION_4D:
			gl.uniform4d(m_po_sampler_uniform_location, 0.0, 1.0, 2.0, 3.0);
			break;

		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(m_po_sampler_uniform_location, 1 /* count */, double_data);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(m_po_sampler_uniform_location, 1 /* count */, double_data);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(m_po_sampler_uniform_location, 1 /* count */, double_data);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(m_po_sampler_uniform_location, 1 /* count */, double_data);
			break;

		case UNIFORM_FUNCTION_MATRIX2DV:
			gl.uniformMatrix2dv(m_po_sampler_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX2X3DV:
			gl.uniformMatrix2x3dv(m_po_sampler_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX2X4DV:
			gl.uniformMatrix2x4dv(m_po_sampler_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX3DV:
			gl.uniformMatrix3dv(m_po_sampler_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX3X2DV:
			gl.uniformMatrix3x2dv(m_po_sampler_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX3X4DV:
			gl.uniformMatrix3x4dv(m_po_sampler_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX4DV:
			gl.uniformMatrix4dv(m_po_sampler_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX4X2DV:
			gl.uniformMatrix4x2dv(m_po_sampler_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX4X3DV:
			gl.uniformMatrix4x3dv(m_po_sampler_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;

		default:
		{
			TCU_FAIL("Unrecognized uniform function");
		}
		}

		/* Make sure GL_INVALID_OPERATION was generated by the call */
		const glw::GLenum error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Function " << getUniformFunctionString(uniform_function)
							   << "() did not generate an error"
								  " when applied against a sampler uniform."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all uniform functions) */

	return result;
}